

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::Modify
          (RemoveUnusedInterfaceVariablesContext *this)

{
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  reference puVar2;
  uint local_a4;
  iterator local_a0;
  undefined8 local_98;
  SmallVector<unsigned_int,_2UL> local_90;
  Operand local_68;
  uint local_34;
  iterator iStack_30;
  uint id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  int i;
  RemoveUnusedInterfaceVariablesContext *this_local;
  
  __range2._4_4_ = opt::Instruction::NumInOperands(this->entry_);
  while (__range2._4_4_ = __range2._4_4_ - 1, 2 < (int)__range2._4_4_) {
    opt::Instruction::RemoveInOperand(this->entry_,__range2._4_4_);
  }
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->operands_to_add_);
  iStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->operands_to_add_)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_a4 = *puVar2;
    this_00 = this->entry_;
    local_a0 = &local_a4;
    local_98 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_a0;
    local_34 = local_a4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_90,init_list);
    Operand::Operand(&local_68,SPV_OPERAND_TYPE_ID,&local_90);
    opt::Instruction::AddOperand(this_00,&local_68);
    Operand::~Operand(&local_68);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_90);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void Modify() {
    for (int i = entry_.NumInOperands() - 1; i >= 3; --i)
      entry_.RemoveInOperand(i);
    for (auto id : operands_to_add_) {
      entry_.AddOperand(Operand(SPV_OPERAND_TYPE_ID, {id}));
    }
  }